

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

ssize_t __thiscall
SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::write
          (ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this,int __fd,void *__buf,
          size_t __n)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar1;
  element_type *this_01;
  Response *this_02;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  __shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_03;
  exception *anon_var_1;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>
  local_68 [2];
  ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *local_48;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session> local_40;
  undefined1 local_30 [8];
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response> response;
  function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
  *resource_function_local;
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session>
  *session_local;
  ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this_local;
  
  this_03 = (__shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)CONCAT44(in_register_00000034,__fd);
  response.
  super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__buf;
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(this_03);
  this_01 = std::
            __shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)peVar1);
  Connection::set_timeout(this_01,(this->config).timeout_content);
  this_02 = (Response *)operator_new(0x170);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session>::
  shared_ptr(&local_40,
             (shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session>
              *)this_03);
  Response::Response(this_02,&local_40,(this->config).timeout_content);
  local_48 = this;
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response>::
  shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response,SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::write(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Session>const&,std::function<void(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response>,std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Request>)>&)::_lambda(SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response*)_1_,void>
            ((shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>>::Response>
              *)local_30,this_02,(anon_class_8_1_8991fb9c_for__M_tp)this);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session>::
  ~shared_ptr(&local_40);
  this_00 = response.
            super___shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>::
  shared_ptr(local_68,(shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>
                       *)local_30);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(this_03);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>::
  shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>
              *)&anon_var_1,&peVar1->request);
  std::
  function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
  ::operator()((function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>)>
                *)this_00._M_pi,local_68,
               (shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>
                *)&anon_var_1);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>::
  ~shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Request>
               *)&anon_var_1);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>::
  ~shared_ptr(local_68);
  std::shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>::
  ~shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::Response>
               *)local_30);
  return extraout_RAX;
}

Assistant:

void write(const std::shared_ptr<Session> &session,
               std::function<void(std::shared_ptr<typename ServerBase<socket_type>::Response>, std::shared_ptr<typename ServerBase<socket_type>::Request>)> &resource_function) {
      session->connection->set_timeout(config.timeout_content);
      auto response = std::shared_ptr<Response>(new Response(session, config.timeout_content), [this](Response *response_ptr) {
        auto response = std::shared_ptr<Response>(response_ptr);
        response->send_on_delete([this, response](const error_code &ec) {
          if(!ec) {
            if(response->close_connection_after_response)
              return;

            auto range = response->session->request->header.equal_range("Connection");
            for(auto it = range.first; it != range.second; it++) {
              if(case_insensitive_equal(it->second, "close"))
                return;
              else if(case_insensitive_equal(it->second, "keep-alive")) {
                auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
                this->read(new_session);
                return;
              }
            }
            if(response->session->request->http_version >= "1.1") {
              auto new_session = std::make_shared<Session>(this->config.max_request_streambuf_size, response->session->connection);
              this->read(new_session);
              return;
            }
          }
          else if(this->on_error)
            this->on_error(response->session->request, ec);
        });
      });

      try {
        resource_function(response, session->request);
      }
      catch(const std::exception &) {
        if(on_error)
          on_error(session->request, make_error_code::make_error_code(errc::operation_canceled));
        return;
      }
    }